

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# momento_test.cc
# Opt level: O0

int main(void)

{
  int iVar1;
  Originator *this;
  CareTaker *this_00;
  int value;
  CareTaker *caretaker;
  Originator *originator;
  
  this = (Originator *)operator_new(4);
  Originator::Originator(this);
  this_00 = (CareTaker *)operator_new(0x20);
  CareTaker::CareTaker(this_00,this);
  Originator::setState(this,10);
  CareTaker::save(this_00);
  iVar1 = Originator::getState(this);
  if (iVar1 != 10) {
    __assert_fail("value == 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/behavioral/momento_test.cc"
                  ,0xf,"int main()");
  }
  Originator::setState(this,0x14);
  CareTaker::save(this_00);
  iVar1 = Originator::getState(this);
  if (iVar1 == 0x14) {
    CareTaker::undo(this_00);
    iVar1 = Originator::getState(this);
    if (iVar1 == 10) {
      return 0;
    }
    __assert_fail("value == 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/behavioral/momento_test.cc"
                  ,0x1a,"int main()");
  }
  __assert_fail("value == 20",
                "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/behavioral/momento_test.cc"
                ,0x15,"int main()");
}

Assistant:

int main() {
  Originator *originator = new Originator;
  CareTaker *caretaker = new CareTaker(originator);

  originator->setState(10);
  caretaker->save();

  int value = originator->getState();
  assert(value == 10);

  originator->setState(20);
  caretaker->save();

  value = originator->getState();
  assert(value == 20);

  caretaker->undo();

  value = originator->getState();
  assert(value == 10);
}